

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O2

expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::tydra::(anonymous_namespace)::UniformToFaceVarying_abi_cxx11_
          (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *src,size_t stride_bytes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts)

{
  _Alloc_hider _Var1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  bool bVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dst;
  size_t num_uniforms;
  allocator local_c9;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  uchar *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_58;
  string local_50 [32];
  
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = src;
  if (src == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    local_c8.m_error._M_dataplus._M_p = "stride_bytes is zero.";
    nonstd::expected_lite::
    expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_c8);
  }
  else {
    local_90._0_8_ = (ulong)(*(long *)(this + 8) - *(long *)this) / (ulong)src;
    if ((ulong)(*(long *)(this + 8) - *(long *)this) % (ulong)src == 0) {
      if ((pointer)local_90._0_8_ ==
          (pointer)(*(long *)(stride_bytes + 8) - *(long *)stride_bytes >> 2)) {
        local_c8.m_error._M_dataplus._M_p = (pointer)0x0;
        local_c8.m_error._M_string_length = 0;
        local_c8.m_error.field_2._M_allocated_capacity = 0;
        local_90._8_8_ = __return_storage_ptr__;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,(size_type)src
                  );
        for (uVar3 = 0;
            __return_storage_ptr__ =
                 (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_90._8_8_,
            uVar3 < (ulong)(*(long *)(stride_bytes + 8) - *(long *)stride_bytes >> 2);
            uVar3 = uVar3 + 1) {
          uVar2 = (ulong)*(uint *)(*(long *)stride_bytes + uVar3 * 4);
          memcpy(local_c8.m_error._M_dataplus._M_p,(void *)(uVar3 * (long)src + *(long *)this),
                 (size_t)src);
          while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
            ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
            insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_a8,
                       (const_iterator)local_a8._M_impl.super__Vector_impl_data._M_finish,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_c8.m_error._M_dataplus._M_p,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_c8.m_error._M_string_length);
          }
        }
        (((storage_t<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
           *)local_90._8_8_)->
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).m_has_value = true;
        (((storage_t<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
           *)local_90._8_8_)->
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_a8._M_impl.super__Vector_impl_data._M_start;
        (((storage_t<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
           *)local_90._8_8_)->
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = local_a8._M_impl.super__Vector_impl_data._M_finish;
        (((storage_t<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
           *)local_90._8_8_)->
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8);
        goto LAB_00282958;
      }
      ::std::__cxx11::string::string
                (local_50,
                 "The number of input uniform attributes {} must be the same with faceVertexCounts.size() {}"
                 ,&local_c9);
      local_80._0_8_ = *(long *)(stride_bytes + 8) - *(long *)stride_bytes >> 2;
      fmt::format<unsigned_long,unsigned_long>
                ((string *)(local_80 + 8),(fmt *)local_50,(string *)local_90,
                 (unsigned_long *)local_80,(unsigned_long *)faceVertexCounts);
    }
    else {
      ::std::__cxx11::string::string
                (local_50,"input bytes {} must be the multiple of stride_bytes {}",
                 (allocator *)local_80);
      local_90._0_8_ = *(long *)(this + 8) - *(long *)this;
      fmt::format<unsigned_long,unsigned_long>
                ((string *)(local_80 + 8),(fmt *)local_50,(string *)local_90,
                 (unsigned_long *)&local_58,(unsigned_long *)faceVertexCounts);
    }
    local_c8.m_error._M_dataplus._M_p = (pointer)&local_c8.m_error.field_2;
    _Var1._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_80._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._8_8_ == &local_68) {
      local_c8.m_error.field_2._8_8_ = local_68._8_8_;
      _Var1._M_p = local_c8.m_error._M_dataplus._M_p;
    }
    local_c8.m_error._M_dataplus._M_p = _Var1._M_p;
    local_c8.m_error.field_2._M_allocated_capacity._1_7_ = local_68._M_allocated_capacity._1_7_;
    local_c8.m_error.field_2._M_local_buf[0] = local_68._M_local_buf[0];
    local_c8.m_error._M_string_length = (size_type)local_70;
    local_70 = (uchar *)0x0;
    local_68._M_local_buf[0] = '\0';
    local_80._8_8_ = &local_68;
    nonstd::expected_lite::
    expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,&local_c8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
LAB_00282958:
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<std::vector<uint8_t>, std::string> UniformToFaceVarying(
    const std::vector<uint8_t> &src, const size_t stride_bytes,
    const std::vector<uint32_t> &faceVertexCounts) {
  std::vector<uint8_t> dst;

  if (stride_bytes == 0) {
    return nonstd::make_unexpected("stride_bytes is zero.");
  }

  if ((src.size() % stride_bytes) != 0) {
    return nonstd::make_unexpected(
        fmt::format("input bytes {} must be the multiple of stride_bytes {}",
                    src.size(), stride_bytes));
  }

  size_t num_uniforms = src.size() / stride_bytes;

  if (num_uniforms != faceVertexCounts.size()) {
    return nonstd::make_unexpected(fmt::format(
        "The number of input uniform attributes {} must be the same with "
        "faceVertexCounts.size() {}",
        num_uniforms, faceVertexCounts.size()));
  }

  std::vector<uint8_t> buf;
  buf.resize(stride_bytes);

  for (size_t i = 0; i < faceVertexCounts.size(); i++) {
    size_t cnt = faceVertexCounts[i];

    memcpy(buf.data(), src.data() + i * stride_bytes, stride_bytes);

    // repeat cnt times.
    for (size_t k = 0; k < cnt; k++) {
      dst.insert(dst.end(), buf.begin(), buf.end());
    }
  }

  return dst;
}